

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

string * demangle_abi_cxx11_(char *mangled_name)

{
  unique_ptr<char,_void_(*)(void_*)> *puVar1;
  undefined8 in_RSI;
  string *in_RDI;
  unique_ptr<char,_void_(*)(void_*)> ptr;
  int status;
  size_t len;
  string *__p;
  allocator local_39;
  code *local_38;
  unique_ptr<char,_void_(*)(void_*)> local_30;
  undefined4 local_1c;
  undefined8 local_18 [3];
  
  local_18[0] = 0;
  local_1c = 0;
  __p = in_RDI;
  __cxa_demangle(in_RSI,0,local_18,&local_1c);
  local_38 = free;
  puVar1 = &local_30;
  std::unique_ptr<char,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            (puVar1,(pointer)__p,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x15e0a6);
  puVar1 = (unique_ptr<char,_void_(*)(void_*)> *)
           std::unique_ptr<char,_void_(*)(void_*)>::get(puVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,(char *)puVar1,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(puVar1);
  return __p;
}

Assistant:

std::string demangle(const char* mangled_name) {
  std::size_t len = 0;
  int status = 0;
  std::unique_ptr<char, decltype(&std::free)> ptr(
      __cxxabiv1::__cxa_demangle(mangled_name, nullptr, &len, &status),
      &std::free);
  return ptr.get();
}